

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O1

void __thiscall libtorrent::aux::session_impl::on_dht_request(session_impl *this)

{
  pointer psVar1;
  element_type *peVar2;
  char cVar3;
  int iVar4;
  undefined8 *in_RCX;
  undefined8 in_RDX;
  pointer psVar5;
  undefined8 in_RSI;
  undefined8 in_R8;
  
  psVar5 = (this->m_ses_extensions)._M_elems[2].
           super__Vector_base<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  psVar1 = (this->m_ses_extensions)._M_elems[3].
           super__Vector_base<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (psVar5 != psVar1) {
    peVar2 = (psVar5->super___shared_ptr<libtorrent::plugin,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    iVar4 = (*peVar2->_vptr_plugin[6])(peVar2,in_RSI,in_RDX,in_RCX + 1,*in_RCX,in_R8);
    cVar3 = (char)iVar4;
    while ((cVar3 == '\0' && (psVar5 = psVar5 + 1, psVar5 != psVar1))) {
      iVar4 = (*((psVar5->super___shared_ptr<libtorrent::plugin,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                )->_vptr_plugin[6])();
      cVar3 = (char)iVar4;
    }
  }
  return;
}

Assistant:

bool session_impl::on_dht_request(string_view query
		, dht::msg const& request, entry& response)
	{
#ifndef TORRENT_DISABLE_EXTENSIONS
		for (auto const& ext : m_ses_extensions[plugins_dht_request_idx])
		{
			if (ext->on_dht_request(query
				, request.addr, request.message, response))
				return true;
		}
#else
		TORRENT_UNUSED(query);
		TORRENT_UNUSED(request);
		TORRENT_UNUSED(response);
#endif
		return false;
	}